

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void iidentity_row_16xn_avx2
               (__m256i *out,int32_t *input,int stride,int shift,int height,int txw_idx,
               int rect_type)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  ushort uVar11;
  int in_ECX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int in_stack_00000008;
  __m256i hi_1;
  __m256i lo_1;
  __m256i src_1;
  int i_1;
  __m256i rect_scale;
  __m256i hi;
  __m256i lo;
  __m256i src;
  int i;
  __m256i scale__r;
  __m256i one;
  __m256i _r;
  __m256i scale;
  int32_t *input_row;
  undefined1 in_stack_fffffffffffff8e0 [32];
  int local_6c4;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  int local_624;
  char local_578;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  
  uVar11 = *(ushort *)(NewSqrt2list + in_R9D);
  auVar1 = vpinsrw_avx(ZEXT216(uVar11),(uint)uVar11,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar11,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar11,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar11,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar11,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar11,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar11,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar11),(uint)uVar11,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar11,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar11,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar11,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar11,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar11,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar11,7);
  uStack_330 = auVar2._0_8_;
  uStack_328 = auVar2._8_8_;
  local_578 = (char)in_ECX;
  uVar11 = (short)(1 << (0xbU - local_578 & 0x1f)) + 0x800;
  auVar2 = vpinsrw_avx(ZEXT216(uVar11),(uint)uVar11,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar11,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar11,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar11,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar11,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar11,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar11,7);
  auVar3 = vpinsrw_avx(ZEXT216(uVar11),(uint)uVar11,1);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar11,2);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar11,3);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar11,4);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar11,5);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar11,6);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar11,7);
  uStack_2f0 = auVar3._0_8_;
  uStack_2e8 = auVar3._8_8_;
  auVar3 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar3 = vpinsrw_avx(auVar3,1,2);
  auVar3 = vpinsrw_avx(auVar3,1,3);
  auVar3 = vpinsrw_avx(auVar3,1,4);
  auVar3 = vpinsrw_avx(auVar3,1,5);
  auVar3 = vpinsrw_avx(auVar3,1,6);
  auVar3 = vpinsrw_avx(auVar3,1,7);
  auVar4 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar4 = vpinsrw_avx(auVar4,1,2);
  auVar4 = vpinsrw_avx(auVar4,1,3);
  auVar4 = vpinsrw_avx(auVar4,1,4);
  auVar4 = vpinsrw_avx(auVar4,1,5);
  auVar4 = vpinsrw_avx(auVar4,1,6);
  auVar4 = vpinsrw_avx(auVar4,1,7);
  uStack_2b0 = auVar4._0_8_;
  uStack_2a8 = auVar4._8_8_;
  auVar12._16_8_ = uStack_330;
  auVar12._0_16_ = auVar1;
  auVar12._24_8_ = uStack_328;
  auVar5._16_8_ = uStack_2f0;
  auVar5._0_16_ = auVar2;
  auVar5._24_8_ = uStack_2e8;
  auVar5 = vpunpcklwd_avx2(auVar12,auVar5);
  if ((in_stack_00000008 == 1) || (in_stack_00000008 == -1)) {
    auVar1 = vpinsrw_avx(ZEXT216(0x5a80),0x5a80,1);
    auVar1 = vpinsrw_avx(auVar1,0x5a80,2);
    auVar1 = vpinsrw_avx(auVar1,0x5a80,3);
    auVar1 = vpinsrw_avx(auVar1,0x5a80,4);
    auVar1 = vpinsrw_avx(auVar1,0x5a80,5);
    auVar1 = vpinsrw_avx(auVar1,0x5a80,6);
    auVar1 = vpinsrw_avx(auVar1,0x5a80,7);
    auVar2 = vpinsrw_avx(ZEXT216(0x5a80),0x5a80,1);
    auVar2 = vpinsrw_avx(auVar2,0x5a80,2);
    auVar2 = vpinsrw_avx(auVar2,0x5a80,3);
    auVar2 = vpinsrw_avx(auVar2,0x5a80,4);
    auVar2 = vpinsrw_avx(auVar2,0x5a80,5);
    auVar2 = vpinsrw_avx(auVar2,0x5a80,6);
    auVar2 = vpinsrw_avx(auVar2,0x5a80,7);
    auVar13._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    auVar12 = auVar13;
    for (local_6c4 = 0; local_6c4 < in_R8D; local_6c4 = local_6c4 + 1) {
      load_32bit_to_16bit_w16_avx2(in_stack_fffffffffffff8e0._16_8_);
      uStack_6b0 = auVar13._16_8_;
      uStack_6a8 = auVar13._24_8_;
      auVar6._16_8_ = uStack_6b0;
      auVar6._0_16_ = auVar13._0_16_;
      auVar6._24_8_ = uStack_6a8;
      auVar12 = vpmulhrsw_avx2(auVar12,auVar6);
      auVar7._16_8_ = uStack_2b0;
      auVar7._0_16_ = auVar3;
      auVar7._24_8_ = uStack_2a8;
      auVar7 = vpunpcklwd_avx2(auVar12,auVar7);
      auVar9._16_8_ = uStack_2b0;
      auVar9._0_16_ = auVar3;
      auVar9._24_8_ = uStack_2a8;
      auVar6 = vpunpckhwd_avx2(auVar12,auVar9);
      auVar12 = vpmaddwd_avx2(auVar7,auVar5);
      auVar6 = vpmaddwd_avx2(auVar6,auVar5);
      in_stack_fffffffffffff8e0 = vpsrad_avx2(auVar12,ZEXT416(0xc - in_ECX));
      auVar12 = vpsrad_avx2(auVar6,ZEXT416(0xc - in_ECX));
      auVar12 = vpackssdw_avx2(in_stack_fffffffffffff8e0,auVar12);
      *(undefined1 (*) [32])(in_RDI + (long)local_6c4 * 0x20) = auVar12;
    }
  }
  else {
    auVar12 = auVar5;
    for (local_624 = 0; local_624 < in_R8D; local_624 = local_624 + 1) {
      load_32bit_to_16bit_w16_avx2(in_stack_fffffffffffff8e0._16_8_);
      auVar8._16_8_ = uStack_2b0;
      auVar8._0_16_ = auVar3;
      auVar8._24_8_ = uStack_2a8;
      auVar6 = vpunpcklwd_avx2(auVar12,auVar8);
      auVar10._16_8_ = uStack_2b0;
      auVar10._0_16_ = auVar3;
      auVar10._24_8_ = uStack_2a8;
      auVar13 = vpunpckhwd_avx2(auVar12,auVar10);
      auVar12 = vpmaddwd_avx2(auVar6,auVar5);
      auVar13 = vpmaddwd_avx2(auVar13,auVar5);
      auVar12 = vpsrad_avx2(auVar12,ZEXT416(0xc - in_ECX));
      auVar13 = vpsrad_avx2(auVar13,ZEXT416(0xc - in_ECX));
      auVar12 = vpackssdw_avx2(auVar12,auVar13);
      *(undefined1 (*) [32])(in_RDI + (long)local_624 * 0x20) = auVar12;
    }
  }
  return;
}

Assistant:

static inline void iidentity_row_16xn_avx2(__m256i *out, const int32_t *input,
                                           int stride, int shift, int height,
                                           int txw_idx, int rect_type) {
  const int32_t *input_row = input;
  const __m256i scale = _mm256_set1_epi16(NewSqrt2list[txw_idx]);
  const __m256i _r = _mm256_set1_epi16((1 << (NewSqrt2Bits - 1)) +
                                       (1 << (NewSqrt2Bits - shift - 1)));
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i scale__r = _mm256_unpacklo_epi16(scale, _r);
  if (rect_type != 1 && rect_type != -1) {
    for (int i = 0; i < height; ++i) {
      const __m256i src = load_32bit_to_16bit_w16_avx2(input_row);
      input_row += stride;
      __m256i lo = _mm256_unpacklo_epi16(src, one);
      __m256i hi = _mm256_unpackhi_epi16(src, one);
      lo = _mm256_madd_epi16(lo, scale__r);
      hi = _mm256_madd_epi16(hi, scale__r);
      lo = _mm256_srai_epi32(lo, NewSqrt2Bits - shift);
      hi = _mm256_srai_epi32(hi, NewSqrt2Bits - shift);
      out[i] = _mm256_packs_epi32(lo, hi);
    }
  } else {
    const __m256i rect_scale =
        _mm256_set1_epi16(NewInvSqrt2 << (15 - NewSqrt2Bits));
    for (int i = 0; i < height; ++i) {
      __m256i src = load_32bit_to_16bit_w16_avx2(input_row);
      src = _mm256_mulhrs_epi16(src, rect_scale);
      input_row += stride;
      __m256i lo = _mm256_unpacklo_epi16(src, one);
      __m256i hi = _mm256_unpackhi_epi16(src, one);
      lo = _mm256_madd_epi16(lo, scale__r);
      hi = _mm256_madd_epi16(hi, scale__r);
      lo = _mm256_srai_epi32(lo, NewSqrt2Bits - shift);
      hi = _mm256_srai_epi32(hi, NewSqrt2Bits - shift);
      out[i] = _mm256_packs_epi32(lo, hi);
    }
  }
}